

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * createTableStmt(sqlite3 *db,Table *p)

{
  short sVar1;
  _func_void_sqlite3_str_ptr_char_ptr_int *__s;
  uint uVar2;
  char *zBuf;
  size_t sVar3;
  long lVar4;
  Column *pCVar5;
  int iVar6;
  char *pcVar7;
  char *zFormat;
  int iVar8;
  int iVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  int k;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0xaaaaaaaa;
  sVar1 = p->nCol;
  if (0 < sVar1) {
    pCVar5 = p->aCol;
    iVar6 = 0;
    iVar9 = 0;
LAB_00180d5c:
    pcVar7 = pCVar5->zCnName;
    iVar8 = 0;
    do {
      if (*pcVar7 == '\"') {
        iVar8 = iVar8 + 1;
      }
      else if (*pcVar7 == '\0') goto LAB_00180d7b;
      iVar8 = iVar8 + 1;
      pcVar7 = pcVar7 + 1;
    } while( true );
  }
  iVar8 = 2;
LAB_00180d98:
  pcVar7 = p->zName;
  iVar6 = 0;
  do {
    if (*pcVar7 == '\"') {
      iVar6 = iVar6 + 1;
    }
    else if (*pcVar7 == '\0') {
      iVar8 = iVar8 + iVar6;
      pcVar7 = ",\n  ";
      if (iVar8 < 0x32) {
        pcVar7 = ",";
      }
      pcVar10 = "\n)";
      if (iVar8 < 0x32) {
        pcVar10 = ")";
      }
      iVar6 = iVar8 + 0x23 + sVar1 * 6;
      zBuf = (char *)sqlite3Malloc((long)iVar6);
      if (zBuf == (char *)0x0) {
        sqlite3OomFault(db);
        zBuf = (char *)0x0;
      }
      else {
        sqlite3_snprintf(iVar6,zBuf,"CREATE TABLE ");
        sVar3 = strlen(zBuf);
        local_3c = (uint)sVar3 & 0x3fffffff;
        identPut(zBuf,(int *)&local_3c,p->zName);
        lVar4 = (long)(int)local_3c;
        local_3c = local_3c + 1;
        zBuf[lVar4] = '(';
        if (0 < p->nCol) {
          pCVar5 = p->aCol;
          zFormat = "\n  ";
          if (iVar8 < 0x32) {
            zFormat = "";
          }
          iVar8 = 0;
          do {
            uVar2 = local_3c;
            lVar4 = (long)(int)local_3c;
            sqlite3_snprintf(iVar6 - local_3c,zBuf + lVar4,zFormat);
            sVar3 = strlen(zBuf + lVar4);
            local_3c = ((uint)sVar3 & 0x3fffffff) + uVar2;
            identPut(zBuf,(int *)&local_3c,pCVar5->zCnName);
            __s = (&sqlite3Apis.str_append)[pCVar5->affinity];
            sVar3 = strlen((char *)__s);
            uVar2 = local_3c;
            memcpy(zBuf + (int)local_3c,__s,(ulong)((uint)sVar3 & 0x3fffffff));
            local_3c = uVar2 + ((uint)sVar3 & 0x3fffffff);
            iVar8 = iVar8 + 1;
            pCVar5 = pCVar5 + 1;
            zFormat = pcVar7;
          } while (iVar8 < p->nCol);
        }
        sqlite3_snprintf(iVar6 - local_3c,zBuf + (int)local_3c,"%s",pcVar10);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return zBuf;
      }
      __stack_chk_fail();
    }
    iVar6 = iVar6 + 1;
    pcVar7 = pcVar7 + 1;
  } while( true );
LAB_00180d7b:
  iVar8 = iVar9 + iVar8;
  iVar9 = iVar8 + 7;
  iVar6 = iVar6 + 1;
  pCVar5 = pCVar5 + 1;
  if (iVar6 == sVar1) goto code_r0x00180d8c;
  goto LAB_00180d5c;
code_r0x00180d8c:
  iVar8 = iVar8 + 9;
  goto LAB_00180d98;
}

Assistant:

static char *createTableStmt(sqlite3 *db, Table *p){
  int i, k, n;
  char *zStmt;
  char *zSep, *zSep2, *zEnd;
  Column *pCol;
  n = 0;
  for(pCol = p->aCol, i=0; i<p->nCol; i++, pCol++){
    n += identLength(pCol->zCnName) + 5;
  }
  n += identLength(p->zName);
  if( n<50 ){
    zSep = "";
    zSep2 = ",";
    zEnd = ")";
  }else{
    zSep = "\n  ";
    zSep2 = ",\n  ";
    zEnd = "\n)";
  }
  n += 35 + 6*p->nCol;
  zStmt = sqlite3DbMallocRaw(0, n);
  if( zStmt==0 ){
    sqlite3OomFault(db);
    return 0;
  }
  sqlite3_snprintf(n, zStmt, "CREATE TABLE ");
  k = sqlite3Strlen30(zStmt);
  identPut(zStmt, &k, p->zName);
  zStmt[k++] = '(';
  for(pCol=p->aCol, i=0; i<p->nCol; i++, pCol++){
    static const char * const azType[] = {
        /* SQLITE_AFF_BLOB    */ "",
        /* SQLITE_AFF_TEXT    */ " TEXT",
        /* SQLITE_AFF_NUMERIC */ " NUM",
        /* SQLITE_AFF_INTEGER */ " INT",
        /* SQLITE_AFF_REAL    */ " REAL",
        /* SQLITE_AFF_FLEXNUM */ " NUM",
    };
    int len;
    const char *zType;

    sqlite3_snprintf(n-k, &zStmt[k], zSep);
    k += sqlite3Strlen30(&zStmt[k]);
    zSep = zSep2;
    identPut(zStmt, &k, pCol->zCnName);
    assert( pCol->affinity-SQLITE_AFF_BLOB >= 0 );
    assert( pCol->affinity-SQLITE_AFF_BLOB < ArraySize(azType) );
    testcase( pCol->affinity==SQLITE_AFF_BLOB );
    testcase( pCol->affinity==SQLITE_AFF_TEXT );
    testcase( pCol->affinity==SQLITE_AFF_NUMERIC );
    testcase( pCol->affinity==SQLITE_AFF_INTEGER );
    testcase( pCol->affinity==SQLITE_AFF_REAL );
    testcase( pCol->affinity==SQLITE_AFF_FLEXNUM );

    zType = azType[pCol->affinity - SQLITE_AFF_BLOB];
    len = sqlite3Strlen30(zType);
    assert( pCol->affinity==SQLITE_AFF_BLOB
            || pCol->affinity==SQLITE_AFF_FLEXNUM
            || pCol->affinity==sqlite3AffinityType(zType, 0) );
    memcpy(&zStmt[k], zType, len);
    k += len;
    assert( k<=n );
  }
  sqlite3_snprintf(n-k, &zStmt[k], "%s", zEnd);
  return zStmt;
}